

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::InputLayout::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430                         \nlayout(location = 4) in ivec4 b;     \nlayout(location = 7) in mat2x3 d[2]; \nlayout(location = 5) in float c[2];  \nlayout(location = 12) in uint f;     \nlayout(location = 13) in vec3 g[2];  \nlayout(location = 0) in mat4 a;      \nlayout(location = 15) in int h;      \nlayout(location = 11) in uvec2 e;    \nvoid main(void)                      \n{                                    \n   vec4 pos;                                           \n   pos.w = h + g[0].x + g[1].y + d[1][1].y;            \n   pos.y = b.x * c[0] + c[1] + d[0][0].x;              \n   pos.x = a[0].x + a[1].y + a[2].z + a[3].w;          \n   pos.z = d[0][1].z + e.x * f + d[1][0].z;            \n   gl_Position = pos;                                  \n}"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 430                         \n"
			   "layout(location = 4) in ivec4 b;     \n"
			   "layout(location = 7) in mat2x3 d[2]; \n"
			   "layout(location = 5) in float c[2];  \n"
			   "layout(location = 12) in uint f;     \n"
			   "layout(location = 13) in vec3 g[2];  \n"
			   "layout(location = 0) in mat4 a;      \n"
			   "layout(location = 15) in int h;      \n"
			   "layout(location = 11) in uvec2 e;    \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "   vec4 pos;                                           \n"
			   "   pos.w = h + g[0].x + g[1].y + d[1][1].y;            \n"
			   "   pos.y = b.x * c[0] + c[1] + d[0][0].x;              \n"
			   "   pos.x = a[0].x + a[1].y + a[2].z + a[3].w;          \n"
			   "   pos.z = d[0][1].z + e.x * f + d[1][0].z;            \n"
			   "   gl_Position = pos;                                  \n"
			   "}";
	}